

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# md5.c
# Opt level: O0

int md5_compress(hash_state *md,uchar *buf)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  ulong32 d;
  ulong32 c;
  ulong32 b;
  ulong32 a;
  ulong32 W [16];
  uint local_1c;
  ulong32 i;
  uchar *buf_local;
  hash_state *md_local;
  
  for (local_1c = 0; local_1c < 0x10; local_1c = local_1c + 1) {
    (&b)[local_1c] = *(ulong32 *)(buf + (local_1c << 2));
    (&b)[local_1c] = (&b)[local_1c];
  }
  uVar4 = (md->sha1).state[1];
  uVar3 = (md->sha1).state[2];
  uVar2 = (md->sha1).state[3];
  uVar1 = ROL((md->sha1).state[0] + (uVar2 ^ uVar4 & (uVar3 ^ uVar2)) + b + 0xd76aa478,7);
  uVar1 = uVar1 + uVar4;
  uVar2 = ROL(uVar2 + (uVar3 ^ uVar1 & (uVar4 ^ uVar3)) + a + 0xe8c7b756,0xc);
  uVar2 = uVar2 + uVar1;
  uVar3 = ROL(uVar3 + (uVar4 ^ uVar2 & (uVar1 ^ uVar4)) + W[0] + 0x242070db,0x11);
  uVar3 = uVar3 + uVar2;
  uVar4 = ROL(uVar4 + (uVar1 ^ uVar3 & (uVar2 ^ uVar1)) + W[1] + 0xc1bdceee,0x16);
  uVar4 = uVar4 + uVar3;
  uVar1 = ROL(uVar1 + (uVar2 ^ uVar4 & (uVar3 ^ uVar2)) + W[2] + 0xf57c0faf,7);
  uVar1 = uVar1 + uVar4;
  uVar2 = ROL(uVar2 + (uVar3 ^ uVar1 & (uVar4 ^ uVar3)) + W[3] + 0x4787c62a,0xc);
  uVar2 = uVar2 + uVar1;
  uVar3 = ROL(uVar3 + (uVar4 ^ uVar2 & (uVar1 ^ uVar4)) + W[4] + 0xa8304613,0x11);
  uVar3 = uVar3 + uVar2;
  uVar4 = ROL(uVar4 + (uVar1 ^ uVar3 & (uVar2 ^ uVar1)) + W[5] + 0xfd469501,0x16);
  uVar4 = uVar4 + uVar3;
  uVar1 = ROL(uVar1 + (uVar2 ^ uVar4 & (uVar3 ^ uVar2)) + W[6] + 0x698098d8,7);
  uVar1 = uVar1 + uVar4;
  uVar2 = ROL(uVar2 + (uVar3 ^ uVar1 & (uVar4 ^ uVar3)) + W[7] + 0x8b44f7af,0xc);
  uVar2 = uVar2 + uVar1;
  uVar3 = ROL((uVar3 + (uVar4 ^ uVar2 & (uVar1 ^ uVar4)) + W[8]) - 0xa44f,0x11);
  uVar3 = uVar3 + uVar2;
  uVar4 = ROL(uVar4 + (uVar1 ^ uVar3 & (uVar2 ^ uVar1)) + W[9] + 0x895cd7be,0x16);
  uVar4 = uVar4 + uVar3;
  uVar1 = ROL(uVar1 + (uVar2 ^ uVar4 & (uVar3 ^ uVar2)) + W[10] + 0x6b901122,7);
  uVar1 = uVar1 + uVar4;
  uVar2 = ROL(uVar2 + (uVar3 ^ uVar1 & (uVar4 ^ uVar3)) + W[0xb] + 0xfd987193,0xc);
  uVar2 = uVar2 + uVar1;
  uVar3 = ROL(uVar3 + (uVar4 ^ uVar2 & (uVar1 ^ uVar4)) + W[0xc] + 0xa679438e,0x11);
  uVar3 = uVar3 + uVar2;
  uVar4 = ROL(uVar4 + (uVar1 ^ uVar3 & (uVar2 ^ uVar1)) + W[0xd] + 0x49b40821,0x16);
  uVar4 = uVar4 + uVar3;
  uVar1 = ROL(uVar1 + (uVar3 ^ uVar2 & (uVar3 ^ uVar4)) + a + 0xf61e2562,5);
  uVar1 = uVar1 + uVar4;
  uVar2 = ROL(uVar2 + (uVar4 ^ uVar3 & (uVar4 ^ uVar1)) + W[4] + 0xc040b340,9);
  uVar2 = uVar2 + uVar1;
  uVar3 = ROL(uVar3 + (uVar1 ^ uVar4 & (uVar1 ^ uVar2)) + W[9] + 0x265e5a51,0xe);
  uVar3 = uVar3 + uVar2;
  uVar4 = ROL(uVar4 + (uVar2 ^ uVar1 & (uVar2 ^ uVar3)) + b + 0xe9b6c7aa,0x14);
  uVar4 = uVar4 + uVar3;
  uVar1 = ROL(uVar1 + (uVar3 ^ uVar2 & (uVar3 ^ uVar4)) + W[3] + 0xd62f105d,5);
  uVar1 = uVar1 + uVar4;
  uVar2 = ROL(uVar2 + (uVar4 ^ uVar3 & (uVar4 ^ uVar1)) + W[8] + 0x2441453,9);
  uVar2 = uVar2 + uVar1;
  uVar3 = ROL(uVar3 + (uVar1 ^ uVar4 & (uVar1 ^ uVar2)) + W[0xd] + 0xd8a1e681,0xe);
  uVar3 = uVar3 + uVar2;
  uVar4 = ROL(uVar4 + (uVar2 ^ uVar1 & (uVar2 ^ uVar3)) + W[2] + 0xe7d3fbc8,0x14);
  uVar4 = uVar4 + uVar3;
  uVar1 = ROL(uVar1 + (uVar3 ^ uVar2 & (uVar3 ^ uVar4)) + W[7] + 0x21e1cde6,5);
  uVar1 = uVar1 + uVar4;
  uVar2 = ROL(uVar2 + (uVar4 ^ uVar3 & (uVar4 ^ uVar1)) + W[0xc] + 0xc33707d6,9);
  uVar2 = uVar2 + uVar1;
  uVar3 = ROL(uVar3 + (uVar1 ^ uVar4 & (uVar1 ^ uVar2)) + W[1] + 0xf4d50d87,0xe);
  uVar3 = uVar3 + uVar2;
  uVar4 = ROL(uVar4 + (uVar2 ^ uVar1 & (uVar2 ^ uVar3)) + W[6] + 0x455a14ed,0x14);
  uVar4 = uVar4 + uVar3;
  uVar1 = ROL(uVar1 + (uVar3 ^ uVar2 & (uVar3 ^ uVar4)) + W[0xb] + 0xa9e3e905,5);
  uVar1 = uVar1 + uVar4;
  uVar2 = ROL(uVar2 + (uVar4 ^ uVar3 & (uVar4 ^ uVar1)) + W[0] + 0xfcefa3f8,9);
  uVar2 = uVar2 + uVar1;
  uVar3 = ROL(uVar3 + (uVar1 ^ uVar4 & (uVar1 ^ uVar2)) + W[5] + 0x676f02d9,0xe);
  uVar3 = uVar3 + uVar2;
  uVar4 = ROL(uVar4 + (uVar2 ^ uVar1 & (uVar2 ^ uVar3)) + W[10] + 0x8d2a4c8a,0x14);
  uVar4 = uVar4 + uVar3;
  uVar1 = ROL((uVar1 + (uVar4 ^ uVar3 ^ uVar2) + W[3]) - 0x5c6be,4);
  uVar1 = uVar1 + uVar4;
  uVar2 = ROL(uVar2 + (uVar1 ^ uVar4 ^ uVar3) + W[6] + 0x8771f681,0xb);
  uVar2 = uVar2 + uVar1;
  uVar3 = ROL(uVar3 + (uVar2 ^ uVar1 ^ uVar4) + W[9] + 0x6d9d6122,0x10);
  uVar3 = uVar3 + uVar2;
  uVar4 = ROL(uVar4 + (uVar3 ^ uVar2 ^ uVar1) + W[0xc] + 0xfde5380c,0x17);
  uVar4 = uVar4 + uVar3;
  uVar1 = ROL(uVar1 + (uVar4 ^ uVar3 ^ uVar2) + a + 0xa4beea44,4);
  uVar1 = uVar1 + uVar4;
  uVar2 = ROL(uVar2 + (uVar1 ^ uVar4 ^ uVar3) + W[2] + 0x4bdecfa9,0xb);
  uVar2 = uVar2 + uVar1;
  uVar3 = ROL(uVar3 + (uVar2 ^ uVar1 ^ uVar4) + W[5] + 0xf6bb4b60,0x10);
  uVar3 = uVar3 + uVar2;
  uVar4 = ROL(uVar4 + (uVar3 ^ uVar2 ^ uVar1) + W[8] + 0xbebfbc70,0x17);
  uVar4 = uVar4 + uVar3;
  uVar1 = ROL(uVar1 + (uVar4 ^ uVar3 ^ uVar2) + W[0xb] + 0x289b7ec6,4);
  uVar1 = uVar1 + uVar4;
  uVar2 = ROL(uVar2 + (uVar1 ^ uVar4 ^ uVar3) + b + 0xeaa127fa,0xb);
  uVar2 = uVar2 + uVar1;
  uVar3 = ROL(uVar3 + (uVar2 ^ uVar1 ^ uVar4) + W[1] + 0xd4ef3085,0x10);
  uVar3 = uVar3 + uVar2;
  uVar4 = ROL(uVar4 + (uVar3 ^ uVar2 ^ uVar1) + W[4] + 0x4881d05,0x17);
  uVar4 = uVar4 + uVar3;
  uVar1 = ROL(uVar1 + (uVar4 ^ uVar3 ^ uVar2) + W[7] + 0xd9d4d039,4);
  uVar1 = uVar1 + uVar4;
  uVar2 = ROL(uVar2 + (uVar1 ^ uVar4 ^ uVar3) + W[10] + 0xe6db99e5,0xb);
  uVar2 = uVar2 + uVar1;
  uVar3 = ROL(uVar3 + (uVar2 ^ uVar1 ^ uVar4) + W[0xd] + 0x1fa27cf8,0x10);
  uVar3 = uVar3 + uVar2;
  uVar4 = ROL(uVar4 + (uVar3 ^ uVar2 ^ uVar1) + W[0] + 0xc4ac5665,0x17);
  uVar4 = uVar4 + uVar3;
  uVar1 = ROL(uVar1 + (uVar3 ^ (uVar4 | uVar2 ^ 0xffffffff)) + b + 0xf4292244,6);
  uVar1 = uVar1 + uVar4;
  uVar2 = ROL(uVar2 + (uVar4 ^ (uVar1 | uVar3 ^ 0xffffffff)) + W[5] + 0x432aff97,10);
  uVar2 = uVar2 + uVar1;
  uVar3 = ROL(uVar3 + (uVar1 ^ (uVar2 | uVar4 ^ 0xffffffff)) + W[0xc] + 0xab9423a7,0xf);
  uVar3 = uVar3 + uVar2;
  uVar4 = ROL(uVar4 + (uVar2 ^ (uVar3 | uVar1 ^ 0xffffffff)) + W[3] + 0xfc93a039,0x15);
  uVar4 = uVar4 + uVar3;
  uVar1 = ROL(uVar1 + (uVar3 ^ (uVar4 | uVar2 ^ 0xffffffff)) + W[10] + 0x655b59c3,6);
  uVar1 = uVar1 + uVar4;
  uVar2 = ROL(uVar2 + (uVar4 ^ (uVar1 | uVar3 ^ 0xffffffff)) + W[1] + 0x8f0ccc92,10);
  uVar2 = uVar2 + uVar1;
  uVar3 = ROL((uVar3 + (uVar1 ^ (uVar2 | uVar4 ^ 0xffffffff)) + W[8]) - 0x100b83,0xf);
  uVar3 = uVar3 + uVar2;
  uVar4 = ROL(uVar4 + (uVar2 ^ (uVar3 | uVar1 ^ 0xffffffff)) + a + 0x85845dd1,0x15);
  uVar4 = uVar4 + uVar3;
  uVar1 = ROL(uVar1 + (uVar3 ^ (uVar4 | uVar2 ^ 0xffffffff)) + W[6] + 0x6fa87e4f,6);
  uVar1 = uVar1 + uVar4;
  uVar2 = ROL(uVar2 + (uVar4 ^ (uVar1 | uVar3 ^ 0xffffffff)) + W[0xd] + 0xfe2ce6e0,10);
  uVar2 = uVar2 + uVar1;
  uVar3 = ROL(uVar3 + (uVar1 ^ (uVar2 | uVar4 ^ 0xffffffff)) + W[4] + 0xa3014314,0xf);
  uVar3 = uVar3 + uVar2;
  uVar4 = ROL(uVar4 + (uVar2 ^ (uVar3 | uVar1 ^ 0xffffffff)) + W[0xb] + 0x4e0811a1,0x15);
  uVar4 = uVar4 + uVar3;
  uVar1 = ROL(uVar1 + (uVar3 ^ (uVar4 | uVar2 ^ 0xffffffff)) + W[2] + 0xf7537e82,6);
  uVar1 = uVar1 + uVar4;
  uVar2 = ROL(uVar2 + (uVar4 ^ (uVar1 | uVar3 ^ 0xffffffff)) + W[9] + 0xbd3af235,10);
  uVar2 = uVar2 + uVar1;
  uVar3 = ROL(uVar3 + (uVar1 ^ (uVar2 | uVar4 ^ 0xffffffff)) + W[0] + 0x2ad7d2bb,0xf);
  uVar3 = uVar3 + uVar2;
  uVar4 = ROL(uVar4 + (uVar2 ^ (uVar3 | uVar1 ^ 0xffffffff)) + W[7] + 0xeb86d391,0x15);
  (md->sha1).state[0] = (md->sha1).state[0] + uVar1;
  (md->sha1).state[1] = (md->sha1).state[1] + uVar4 + uVar3;
  (md->sha1).state[2] = (md->sha1).state[2] + uVar3;
  (md->sha1).state[3] = (md->sha1).state[3] + uVar2;
  return 0;
}

Assistant:

static int  md5_compress(hash_state *md, unsigned char *buf)
#endif
{
    ulong32 i, W[16], a, b, c, d;
#ifdef LTC_SMALL_CODE
    ulong32 t;
#endif

    /* copy the state into 512-bits into W[0..15] */
    for (i = 0; i < 16; i++) {
        LOAD32L(W[i], buf + (4*i));
    }

    /* copy state */
    a = md->md5.state[0];
    b = md->md5.state[1];
    c = md->md5.state[2];
    d = md->md5.state[3];

#ifdef LTC_SMALL_CODE
    for (i = 0; i < 16; ++i) {
        FF(a,b,c,d,W[Worder[i]],Rorder[i],Korder[i]);
        t = d; d = c; c = b; b = a; a = t;
    }

    for (; i < 32; ++i) {
        GG(a,b,c,d,W[Worder[i]],Rorder[i],Korder[i]);
        t = d; d = c; c = b; b = a; a = t;
    }

    for (; i < 48; ++i) {
        HH(a,b,c,d,W[Worder[i]],Rorder[i],Korder[i]);
        t = d; d = c; c = b; b = a; a = t;
    }

    for (; i < 64; ++i) {
        II(a,b,c,d,W[Worder[i]],Rorder[i],Korder[i]);
        t = d; d = c; c = b; b = a; a = t;
    }

#else
    FF(a,b,c,d,W[0],7,0xd76aa478UL)
    FF(d,a,b,c,W[1],12,0xe8c7b756UL)
    FF(c,d,a,b,W[2],17,0x242070dbUL)
    FF(b,c,d,a,W[3],22,0xc1bdceeeUL)
    FF(a,b,c,d,W[4],7,0xf57c0fafUL)
    FF(d,a,b,c,W[5],12,0x4787c62aUL)
    FF(c,d,a,b,W[6],17,0xa8304613UL)
    FF(b,c,d,a,W[7],22,0xfd469501UL)
    FF(a,b,c,d,W[8],7,0x698098d8UL)
    FF(d,a,b,c,W[9],12,0x8b44f7afUL)
    FF(c,d,a,b,W[10],17,0xffff5bb1UL)
    FF(b,c,d,a,W[11],22,0x895cd7beUL)
    FF(a,b,c,d,W[12],7,0x6b901122UL)
    FF(d,a,b,c,W[13],12,0xfd987193UL)
    FF(c,d,a,b,W[14],17,0xa679438eUL)
    FF(b,c,d,a,W[15],22,0x49b40821UL)
    GG(a,b,c,d,W[1],5,0xf61e2562UL)
    GG(d,a,b,c,W[6],9,0xc040b340UL)
    GG(c,d,a,b,W[11],14,0x265e5a51UL)
    GG(b,c,d,a,W[0],20,0xe9b6c7aaUL)
    GG(a,b,c,d,W[5],5,0xd62f105dUL)
    GG(d,a,b,c,W[10],9,0x02441453UL)
    GG(c,d,a,b,W[15],14,0xd8a1e681UL)
    GG(b,c,d,a,W[4],20,0xe7d3fbc8UL)
    GG(a,b,c,d,W[9],5,0x21e1cde6UL)
    GG(d,a,b,c,W[14],9,0xc33707d6UL)
    GG(c,d,a,b,W[3],14,0xf4d50d87UL)
    GG(b,c,d,a,W[8],20,0x455a14edUL)
    GG(a,b,c,d,W[13],5,0xa9e3e905UL)
    GG(d,a,b,c,W[2],9,0xfcefa3f8UL)
    GG(c,d,a,b,W[7],14,0x676f02d9UL)
    GG(b,c,d,a,W[12],20,0x8d2a4c8aUL)
    HH(a,b,c,d,W[5],4,0xfffa3942UL)
    HH(d,a,b,c,W[8],11,0x8771f681UL)
    HH(c,d,a,b,W[11],16,0x6d9d6122UL)
    HH(b,c,d,a,W[14],23,0xfde5380cUL)
    HH(a,b,c,d,W[1],4,0xa4beea44UL)
    HH(d,a,b,c,W[4],11,0x4bdecfa9UL)
    HH(c,d,a,b,W[7],16,0xf6bb4b60UL)
    HH(b,c,d,a,W[10],23,0xbebfbc70UL)
    HH(a,b,c,d,W[13],4,0x289b7ec6UL)
    HH(d,a,b,c,W[0],11,0xeaa127faUL)
    HH(c,d,a,b,W[3],16,0xd4ef3085UL)
    HH(b,c,d,a,W[6],23,0x04881d05UL)
    HH(a,b,c,d,W[9],4,0xd9d4d039UL)
    HH(d,a,b,c,W[12],11,0xe6db99e5UL)
    HH(c,d,a,b,W[15],16,0x1fa27cf8UL)
    HH(b,c,d,a,W[2],23,0xc4ac5665UL)
    II(a,b,c,d,W[0],6,0xf4292244UL)
    II(d,a,b,c,W[7],10,0x432aff97UL)
    II(c,d,a,b,W[14],15,0xab9423a7UL)
    II(b,c,d,a,W[5],21,0xfc93a039UL)
    II(a,b,c,d,W[12],6,0x655b59c3UL)
    II(d,a,b,c,W[3],10,0x8f0ccc92UL)
    II(c,d,a,b,W[10],15,0xffeff47dUL)
    II(b,c,d,a,W[1],21,0x85845dd1UL)
    II(a,b,c,d,W[8],6,0x6fa87e4fUL)
    II(d,a,b,c,W[15],10,0xfe2ce6e0UL)
    II(c,d,a,b,W[6],15,0xa3014314UL)
    II(b,c,d,a,W[13],21,0x4e0811a1UL)
    II(a,b,c,d,W[4],6,0xf7537e82UL)
    II(d,a,b,c,W[11],10,0xbd3af235UL)
    II(c,d,a,b,W[2],15,0x2ad7d2bbUL)
    II(b,c,d,a,W[9],21,0xeb86d391UL)
#endif

    md->md5.state[0] = md->md5.state[0] + a;
    md->md5.state[1] = md->md5.state[1] + b;
    md->md5.state[2] = md->md5.state[2] + c;
    md->md5.state[3] = md->md5.state[3] + d;

    return CRYPT_OK;
}